

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_cont_mgau.c
# Opt level: O0

int32 approx_cont_mgau_frame_eval
                (mdef_t *mdef,subvq_t *svq,gs_t *gs,mgau_model_t *g,fast_gmm_t *fastgmm,ascr_t *a,
                float32 *feat,int32 frame,int32 *cache_ci_senscr,ptmr_t *tm_ovrhd,logmath_t *logmath
                )

{
  int32 svq_beam_00;
  int32 *ci_occ_00;
  s3senid_t *cd2cisen_00;
  uint8 *sen_active_00;
  uint8 *puVar1;
  int32 *senscr_00;
  int32 iVar2;
  int32 iVar3;
  bool bVar4;
  int32 *senscr;
  uint8 *rec_sen_active;
  uint8 *sen_active;
  undefined4 local_90;
  int32 single_el_list [2];
  float32 tighten_factor;
  int32 dyn_ci_pbeam;
  int32 total;
  s3senid_t *cd2cisen;
  int32 *ci_occ;
  int32 svq_beam;
  int32 is_ciphone;
  int32 pbest;
  int32 is_compute;
  int32 is_skip;
  int32 best_cid;
  int32 n_cig;
  int32 n_cis;
  int32 ng;
  int32 ns;
  int32 best;
  int32 s;
  ascr_t *a_local;
  fast_gmm_t *fastgmm_local;
  mgau_model_t *g_local;
  gs_t *gs_local;
  subvq_t *svq_local;
  mdef_t *mdef_local;
  
  ng = -0x80000000;
  svq_beam = -0x80000000;
  n_cis = 0;
  n_cig = 0;
  is_compute = -1;
  sen_active._4_4_ = -1;
  local_90 = 0xffffffff;
  svq_beam_00 = fastgmm->gaus->subvqbeam;
  ci_occ_00 = fastgmm->gmms->ci_occu;
  cd2cisen_00 = mdef->cd2cisen;
  sen_active_00 = a->sen_active;
  puVar1 = a->rec_sen_active;
  senscr_00 = a->senscr;
  ptmr_start(tm_ovrhd);
  if (gs != (gs_t *)0x0) {
    is_compute = gc_compute_closest_cw(gs,feat);
  }
  if (svq != (subvq_t *)0x0) {
    subvq_gautbl_eval_logs3(svq,feat,logmath);
  }
  if (fastgmm->gmms->max_cd < mdef->n_sen - mdef->n_ci_sen) {
    single_el_list[1] =
         approx_compute_dyn_ci_pbeam
                   (mdef,fastgmm,g,ci_occ_00,sen_active_00,cache_ci_senscr,cd2cisen_00);
  }
  else {
    single_el_list[1] = fastgmm->gmms->ci_pbeam;
  }
  single_el_list[0] = (int32)fastgmm->gmms->tighten_factor;
  ptmr_stop(tm_ovrhd);
  iVar2 = approx_isskip(frame,fastgmm,is_compute);
  fastgmm->gaus->rec_bstcid = is_compute;
  if (iVar2 != 0) {
    single_el_list[1] = (int32)((float)single_el_list[1] * (float)single_el_list[0]);
  }
  for (ns = 0; ns < g->n_mgau; ns = ns + 1) {
    bVar4 = true;
    if (sen_active_00 != (uint8 *)0x0) {
      bVar4 = sen_active_00[ns] != '\0';
    }
    iVar3 = mdef_is_cisenone(mdef,(s3senid_t)ns);
    if (iVar3 == 0) {
      if (bVar4) {
        if (senscr_00[cd2cisen_00[ns]] < svq_beam + single_el_list[1]) {
          if ((g->mgau[ns].bstidx == -1) || (g->mgau[ns].updatetime != frame + -1)) {
            senscr_00[ns] = senscr_00[cd2cisen_00[ns]];
          }
          else {
            sen_active._4_4_ = g->mgau[ns].bstidx;
            if (iVar2 == 0) {
              iVar3 = mgau_eval(g,ns,(int32 *)((long)&sen_active + 4),feat,frame,0);
              senscr_00[ns] = iVar3;
            }
            else {
              iVar3 = mgau_eval(g,ns,(int32 *)((long)&sen_active + 4),feat,frame,1);
              senscr_00[ns] = iVar3;
            }
            n_cig = n_cig + 1;
          }
        }
        else {
          iVar3 = approx_mgau_eval(gs,svq,g,fastgmm,ns,senscr_00,feat,is_compute,svq_beam_00,frame);
          n_cig = iVar3 + n_cig;
          n_cis = n_cis + 1;
        }
        if (ng < senscr_00[ns]) {
          ng = senscr_00[ns];
        }
      }
    }
    else {
      senscr_00[ns] = cache_ci_senscr[ns];
      if (svq_beam < senscr_00[ns]) {
        svq_beam = senscr_00[ns];
      }
      if (ng < senscr_00[ns]) {
        ng = senscr_00[ns];
      }
      sen_active_00[ns] = '\x01';
    }
    puVar1[ns] = sen_active_00[ns];
  }
  for (ns = 0; ns < g->n_mgau; ns = ns + 1) {
    if (sen_active_00[ns] != '\0') {
      senscr_00[ns] = senscr_00[ns] - ng;
    }
  }
  g->frm_sen_eval = n_cis;
  g->frm_gau_eval = n_cig;
  return ng;
}

Assistant:

int32
approx_cont_mgau_frame_eval(mdef_t * mdef,
                            subvq_t * svq,
                            gs_t * gs,
                            mgau_model_t * g,
                            fast_gmm_t * fastgmm,
                            ascr_t * a,
                            float32 * feat,
                            int32 frame,
                            int32 * cache_ci_senscr,
                            ptmr_t * tm_ovrhd,
                            logmath_t * logmath)
{
    int32 s;
    int32 best, ns, ng, n_cis, n_cig;
    int32 best_cid;
    int32 is_skip;
    int32 is_compute;
    int32 pbest;
    int32 is_ciphone;
    int32 svq_beam;
    int32 *ci_occ;
    s3senid_t *cd2cisen;

    int32 total;
    int32 dyn_ci_pbeam;
    float32 tighten_factor;

    int32 single_el_list[2];
    uint8 *sen_active;
    uint8 *rec_sen_active;
    int32 *senscr;

    best = MAX_NEG_INT32;
    pbest = MAX_NEG_INT32;
    ns = 0;
    n_cis = 0;
    n_cig = 0;
    ng = 0;
    total = 0;
    best_cid = -1;


    single_el_list[0] = -1;
    single_el_list[1] = -1;
    svq_beam = fastgmm->gaus->subvqbeam;

    ci_occ = fastgmm->gmms->ci_occu;
    cd2cisen = mdef_cd2cisen(mdef);

    sen_active = a->sen_active;
    rec_sen_active = a->rec_sen_active;
    senscr = a->senscr;

    ptmr_start(tm_ovrhd);
    if (gs)
        best_cid = gc_compute_closest_cw(gs, feat);
    if (svq)
        subvq_gautbl_eval_logs3(svq, feat, logmath);

    if (fastgmm->gmms->max_cd < mdef->n_sen - mdef->n_ci_sen)
        dyn_ci_pbeam = approx_compute_dyn_ci_pbeam(mdef, fastgmm, g,
                                                   ci_occ, sen_active,
                                                   cache_ci_senscr,
                                                   cd2cisen);
    else
        dyn_ci_pbeam = fastgmm->gmms->ci_pbeam;

    tighten_factor = fastgmm->gmms->tighten_factor;

    ptmr_stop(tm_ovrhd);

    is_skip = approx_isskip(frame, fastgmm, best_cid);
    fastgmm->gaus->rec_bstcid = best_cid;

    /* Use the original */

    /* If the frame is "skipped", tighten the beam. */
    if (is_skip) {
        dyn_ci_pbeam = (int32) ((float32) dyn_ci_pbeam * tighten_factor);
    }

    for (s = 0; s < g->n_mgau; s++) {
        is_compute = !sen_active || sen_active[s];
        is_ciphone = mdef_is_cisenone(mdef, s);

#if 0
        if (sen_active[s])
            E_INFO
                ("Sen active %d, rec_sen_active %d, sen id %d cisen id %d, best index %d, update time %d\n",
                 sen_active[s], rec_sen_active[s], s, cd2cisen[s],
                 g->mgau[s].bstidx, g->mgau[s].updatetime);
#endif

        /* Compute the score of the CI phone even if it is not active. */
        if (is_ciphone) {
            /*Just copied from the cache, we just do accouting here */
            /*E_INFO("At senone %d, CI phoneme score %d \n",s,cache_ci_senscr[s]); */
            senscr[s] = cache_ci_senscr[s];
            if (pbest < senscr[s])
                pbest = senscr[s];
            if (best < senscr[s])
                best = senscr[s];
            sen_active[s] = 1;
        }
        else {
            if (is_compute) {
                if ((senscr[cd2cisen[s]] >= pbest + dyn_ci_pbeam)) {
                    ng +=
                        approx_mgau_eval(gs, svq, g, fastgmm, s, senscr,
                                         feat, best_cid, svq_beam, frame);
                    ns++;
                }
                else {

                    /* 3.6 logic: 
                       Whenever it is possible, CD senone score is backed off to the
                       score computed by the best matching index. Otherwise, CI
                       scores will be used.
                     */
                    if (g->mgau[s].bstidx == NO_BSTIDX ||       /* If the gaussian was not computed before. or */
                        g->mgau[s].updatetime != frame - 1      /* It the gaussian was not updated in last frame */
                        ) {
                        /*Previous frames, senone s is not computed. 
                           or the best index is not trusted. 
                           Use CI score in these cases. */
#ifdef GAUDEBUG
                        E_INFO
                            ("USE CI SENONE SCORE at senone %d time %d\n",
                             s, frame);
#endif

                        senscr[s] = senscr[cd2cisen[s]];

                    }
                    else {
                        /*Don't change the bstidx and updatetime */
                        single_el_list[0] = g->mgau[s].bstidx;

                        /*ARCHAN: Please don't rewrite this two lines. I want to make a contrast between the two situations. */
                        if (is_skip)
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 1);        /*Update the best idx, such that next frames can use it */
                        else
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 0);        /*Not update the best index in a Gaussian */

                        ng++;   /* But don't increase the number of senone compute. It doesn't count. */

#ifdef GAUDEBUG
                        E_INFO
                            ("RECOMPUTE for senone %d USING BEST INDEX %d time %d, single Gauss score %d, ci score %d, last ci score %d. \n",
                             s, g->mgau[s].bstidx, frame, senscr[s],
                             senscr[cd2cisen[s]], g->mgau[s].bstscr);
#endif

                    }
                }
                if (best < senscr[s])
                    best = senscr[s];
            }
        }
        /*Make a copy to the most recent active list */
        rec_sen_active[s] = sen_active[s];
    }

    for (s = 0; s < g->n_mgau; s++) {
        if (sen_active[s])
            senscr[s] -= best;
    }


    /*Don't delete this line, it is very useful in analysing the performance */

#if APPROX_ANALYSE
    E_INFO("time: %d , cisen %d, sen: %d, gau: %d\n", frame, n_cis, ns,
           ng);
#endif

    g->frm_sen_eval = ns;
    g->frm_gau_eval = ng;
    ci_occ = NULL;
    return best;


}